

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

void Cec_ManSimClassCreate(Gia_Man_t *p,Vec_Int_t *vClass)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  if (vClass->nSize < 1) {
    __assert_fail("Vec_IntSize(vClass) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0xed,"void Cec_ManSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
  }
  if (vClass->nSize < 1) {
    lVar4 = -1;
  }
  else {
    uVar3 = 0xfffffff;
    lVar2 = 0;
    uVar5 = 0xffffffff;
    do {
      uVar1 = vClass->pArray[lVar2];
      lVar4 = (long)(int)uVar1;
      if (lVar2 == 0) {
        p->pReprs[lVar4] = (Gia_Rpr_t)((uint)p->pReprs[lVar4] | 0xfffffff);
        uVar3 = uVar1;
      }
      else {
        if ((int)uVar1 <= (int)uVar3) {
          __assert_fail("Repr < Ent",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                        ,0xf8,"void Cec_ManSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
        }
        p->pReprs[lVar4] = (Gia_Rpr_t)((uint)p->pReprs[lVar4] & 0xf0000000 | uVar3 & 0xfffffff);
        p->pNexts[(int)uVar5] = uVar1;
      }
      lVar2 = lVar2 + 1;
      uVar5 = uVar1;
    } while (lVar2 < vClass->nSize);
  }
  p->pNexts[lVar4] = 0;
  return;
}

Assistant:

void Cec_ManSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass )
{
    int Repr = GIA_VOID, EntPrev = -1, Ent, i;
    assert( Vec_IntSize(vClass) > 0 );
    Vec_IntForEachEntry( vClass, Ent, i )
    {
        if ( i == 0 )
        {
            Repr = Ent;
            Gia_ObjSetRepr( p, Ent, GIA_VOID );
            EntPrev = Ent;
        }
        else
        {
            assert( Repr < Ent );
            Gia_ObjSetRepr( p, Ent, Repr );
            Gia_ObjSetNext( p, EntPrev, Ent );
            EntPrev = Ent;
        }
    }
    Gia_ObjSetNext( p, EntPrev, 0 );
}